

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void __thiscall
google::protobuf::DescriptorBuilder::BuildMethod
          (DescriptorBuilder *this,MethodDescriptorProto *proto,ServiceDescriptor *parent,
          MethodDescriptor *result)

{
  Tables *pTVar1;
  Symbol symbol;
  MethodDescriptor *parent_00;
  ServiceDescriptor *proto_00;
  bool bVar2;
  _Alloc_hider _Var3;
  string *psVar4;
  MethodOptions *orig_options;
  string *name;
  Symbol local_40;
  string *local_30;
  string *full_name;
  MethodDescriptor *result_local;
  ServiceDescriptor *parent_local;
  MethodDescriptorProto *proto_local;
  DescriptorBuilder *this_local;
  
  pTVar1 = this->tables_;
  full_name = (string *)result;
  result_local = (MethodDescriptor *)parent;
  parent_local = (ServiceDescriptor *)proto;
  proto_local = (MethodDescriptorProto *)this;
  psVar4 = MethodDescriptorProto::name_abi_cxx11_(proto);
  psVar4 = DescriptorPool::Tables::AllocateString(pTVar1,psVar4);
  *(string **)full_name = psVar4;
  (full_name->field_2)._M_allocated_capacity = (size_type)result_local;
  pTVar1 = this->tables_;
  psVar4 = ServiceDescriptor::full_name_abi_cxx11_((ServiceDescriptor *)result_local);
  local_30 = DescriptorPool::Tables::AllocateString(pTVar1,psVar4);
  std::__cxx11::string::append((ulong)local_30,'\x01');
  std::__cxx11::string::append((string *)local_30);
  full_name->_M_string_length = (size_type)local_30;
  psVar4 = MethodDescriptorProto::name_abi_cxx11_((MethodDescriptorProto *)parent_local);
  ValidateSymbolName(this,psVar4,local_30,(Message *)parent_local);
  internal::LazyDescriptor::Init((LazyDescriptor *)((long)&full_name->field_2 + 8));
  internal::LazyDescriptor::Init((LazyDescriptor *)((long)&full_name[1].field_2 + 8));
  bVar2 = MethodDescriptorProto::has_options((MethodDescriptorProto *)parent_local);
  if (bVar2) {
    orig_options = MethodDescriptorProto::options((MethodDescriptorProto *)parent_local);
    AllocateOptions<google::protobuf::MethodDescriptor>
              (this,orig_options,(MethodDescriptor *)full_name);
  }
  else {
    *(undefined8 *)((long)&full_name[2].field_2 + 8) = 0;
  }
  _Var3 = (_Alloc_hider)
          MethodDescriptorProto::client_streaming((MethodDescriptorProto *)parent_local);
  full_name[3]._M_dataplus = _Var3;
  bVar2 = MethodDescriptorProto::server_streaming((MethodDescriptorProto *)parent_local);
  full_name[3].field_0x1 = bVar2;
  psVar4 = MethodDescriptor::full_name_abi_cxx11_((MethodDescriptor *)full_name);
  parent_00 = result_local;
  name = MethodDescriptor::name_abi_cxx11_((MethodDescriptor *)full_name);
  proto_00 = parent_local;
  Symbol::Symbol(&local_40,(MethodDescriptor *)full_name);
  symbol.field_1.descriptor = local_40.field_1.descriptor;
  symbol.type = local_40.type;
  symbol._4_4_ = local_40._4_4_;
  AddSymbol(this,psVar4,parent_00,name,(Message *)proto_00,symbol);
  return;
}

Assistant:

void DescriptorBuilder::BuildMethod(const MethodDescriptorProto& proto,
                                    const ServiceDescriptor* parent,
                                    MethodDescriptor* result) {
  result->name_    = tables_->AllocateString(proto.name());
  result->service_ = parent;

  string* full_name = tables_->AllocateString(parent->full_name());
  full_name->append(1, '.');
  full_name->append(*result->name_);
  result->full_name_ = full_name;

  ValidateSymbolName(proto.name(), *full_name, proto);

  // These will be filled in when cross-linking.
  result->input_type_.Init();
  result->output_type_.Init();

  // Copy options.
  if (!proto.has_options()) {
    result->options_ = NULL;  // Will set to default_instance later.
  } else {
    AllocateOptions(proto.options(), result);
  }

  result->client_streaming_ = proto.client_streaming();
  result->server_streaming_ = proto.server_streaming();

  AddSymbol(result->full_name(), parent, result->name(),
            proto, Symbol(result));
}